

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O0

bool CEditor::PopupSelectGametileOp(void *pContext,CUIRect View)

{
  int iVar1;
  CUIRect *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  void *in_XMM1_Qa;
  uint i;
  CEditor *pEditor;
  CUIRect Button;
  CUIRect *in_stack_ffffffffffffffb8;
  float Cut;
  CUIRect *pCVar2;
  CUIRect *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  char *pText;
  CEditor *this;
  
  this = *(CEditor **)(in_FS_OFFSET + 0x28);
  pText = (char *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  pCVar2 = in_RDI;
  for (Cut = 0.0; (uint)Cut < PopupSelectGametileOp::s_NumButtons; Cut = (float)((int)Cut + 1)) {
    CUIRect::HSplitTop(in_RDI,Cut,in_stack_ffffffffffffffb8,(CUIRect *)0x215b92);
    CUIRect::HSplitTop(in_RDI,Cut,in_stack_ffffffffffffffb8,(CUIRect *)0x215bac);
    in_stack_ffffffffffffffb8 = (CUIRect *)0x0;
    iVar1 = DoButton_Editor(this,in_XMM1_Qa,pText,in_stack_ffffffffffffffe4,
                            in_stack_ffffffffffffffd8,(int)((ulong)pCVar2 >> 0x20),
                            (char *)Button._0_8_);
    if (iVar1 != 0) {
      s_GametileOpSelected = (int)Cut;
    }
  }
  if (*(CEditor **)(in_FS_OFFSET + 0x28) == this) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool CEditor::PopupSelectGametileOp(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	static const char *s_pButtonNames[] = { "Clear", "Collision", "Death", "Unhookable" };
	static unsigned s_NumButtons = sizeof(s_pButtonNames) / sizeof(char*);
	CUIRect Button;

	for(unsigned i = 0; i < s_NumButtons; ++i)
	{
		View.HSplitTop(2.0f, 0, &View);
		View.HSplitTop(12.0f, &Button, &View);
		if(pEditor->DoButton_Editor(&s_pButtonNames[i], s_pButtonNames[i], 0, &Button, 0, 0))
			s_GametileOpSelected = i;
	}

	return false;
}